

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat.hpp
# Opt level: O0

mat3f * inverse(mat3f a)

{
  float fVar1;
  float fVar2;
  mat3f a_00;
  float *pfVar3;
  mat3f *in_RDI;
  float fVar4;
  int j;
  int i;
  float invdet;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  mat3f *this;
  mat3f *this_00;
  float in_stack_ffffffffffffffd0;
  uint i_00;
  int local_2c;
  undefined1 local_28 [36];
  float local_4;
  
  this = (mat3f *)&stack0x00000008;
  this_00 = in_RDI;
  memcpy(local_28,this,0x24);
  a_00.data[0][1] = (float)in_stack_ffffffffffffffb4;
  a_00.data[0][0] = (float)in_stack_ffffffffffffffb0;
  a_00.data._8_8_ = in_RDI;
  a_00.data[1]._4_8_ = this;
  a_00.data[2]._0_8_ = this_00;
  a_00.data[2][2] = in_stack_ffffffffffffffd0;
  local_4 = det(a_00);
  local_4 = 1.0 / local_4;
  mat3f::mat3f((mat3f *)0x183ecb);
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    for (i_00 = 0; (int)i_00 < 3; i_00 = i_00 + 1) {
      pfVar3 = mat3f::operator[](this,(local_2c + 1) % 3);
      fVar4 = pfVar3[(int)(i_00 + 1) % 3];
      pfVar3 = mat3f::operator[](this,(local_2c + 2) % 3);
      fVar1 = pfVar3[(int)(i_00 + 2) % 3];
      pfVar3 = mat3f::operator[](this,(local_2c + 2) % 3);
      fVar2 = pfVar3[(int)(i_00 + 1) % 3];
      pfVar3 = mat3f::operator[](this,(local_2c + 1) % 3);
      fVar4 = (fVar4 * fVar1 + -(fVar2 * pfVar3[(int)(i_00 + 2) % 3])) * local_4;
      pfVar3 = mat3f::operator[](this_00,i_00);
      pfVar3[local_2c] = fVar4;
    }
  }
  return in_RDI;
}

Assistant:

inline mat3f inverse(mat3f a)
{
	float invdet = 1/det(a);
	mat3f res;
	for (int i=0; i<3; ++i)
		for (int j=0; j<3; ++j)
			res[j][i] = (a[(i+1)%3][(j+1)%3] * a[(i+2)%3][(j+2)%3] - a[(i+2)%3][(j+1)%3] * a[(i+1)%3][(j+2)%3]) * invdet;
	return res;
}